

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hasher.cpp
# Opt level: O0

void __thiscall crypto::hasher::hasher(hasher *this,checksum_type type)

{
  undefined4 in_ESI;
  undefined4 in_register_00000034;
  undefined4 *in_RDI;
  
  *in_RDI = in_ESI;
  switch(*in_RDI) {
  case 0:
    break;
  case 1:
    adler32::init((adler32 *)(in_RDI + 1),(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,in_ESI));
    break;
  case 2:
    crc32::init((crc32 *)(in_RDI + 1),(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,in_ESI));
    break;
  case 3:
    iterated_hash<crypto::md5_transform>::init
              ((iterated_hash<crypto::md5_transform> *)(in_RDI + 1),
               (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,in_ESI));
    break;
  case 4:
    iterated_hash<crypto::sha1_transform>::init
              ((iterated_hash<crypto::sha1_transform> *)(in_RDI + 1),
               (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,in_ESI));
    break;
  case 5:
    iterated_hash<crypto::sha256_transform>::init
              ((iterated_hash<crypto::sha256_transform> *)(in_RDI + 1),
               (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,in_ESI));
    break;
  case 6:
  }
  return;
}

Assistant:

hasher::hasher(checksum_type type) : active_type(type) {
	
	switch(active_type) {
		case crypto::None: break;
		case crypto::Adler32: adler32.init(); break;
		case crypto::CRC32: crc32.init(); break;
		case crypto::MD5: md5.init(); break;
		case crypto::SHA1: sha1.init(); break;
		case crypto::SHA256: sha256.init(); break;
		case crypto::PBKDF2_SHA256_XChaCha20: break;
	};
	
}